

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

string * google::protobuf::compiler::ruby::PackageToModule
                   (string *__return_storage_ptr__,string *name)

{
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (name->_M_string_length != 0) {
    uVar1 = 0;
    do {
      if ((name->_M_dataplus)._M_p[uVar1] != '_') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < name->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PackageToModule(const std::string& name) {
  bool next_upper = true;
  std::string result;
  result.reserve(name.size());

  for (int i = 0; i < name.size(); i++) {
    if (name[i] == '_') {
      next_upper = true;
    } else {
      if (next_upper) {
        result.push_back(UpperChar(name[i]));
      } else {
        result.push_back(name[i]);
      }
      next_upper = false;
    }
  }

  return result;
}